

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint value;
  void *pvVar1;
  uint FCHECK;
  uint CMFFLG;
  uint FDICT;
  uint FLEVEL;
  uint CMF;
  uint ADLER32;
  size_t deflatesize;
  uchar *deflatedata;
  size_t sStack_38;
  uint error;
  size_t i;
  LodePNGCompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t *outsize_local;
  uchar **out_local;
  
  deflatesize = 0;
  _CMF = 0;
  i = (size_t)settings;
  settings_local = (LodePNGCompressSettings *)insize;
  insize_local = (size_t)in;
  in_local = (uchar *)outsize;
  outsize_local = (size_t *)out;
  deflatedata._4_4_ = deflate((uchar **)&deflatesize,(size_t *)&CMF,in,insize,settings);
  *outsize_local = 0;
  in_local[0] = '\0';
  in_local[1] = '\0';
  in_local[2] = '\0';
  in_local[3] = '\0';
  in_local[4] = '\0';
  in_local[5] = '\0';
  in_local[6] = '\0';
  in_local[7] = '\0';
  if (deflatedata._4_4_ == 0) {
    *(size_t *)in_local = _CMF + 6;
    pvVar1 = lodepng_malloc(*(size_t *)in_local);
    *outsize_local = (size_t)pvVar1;
    if (*outsize_local == 0) {
      deflatedata._4_4_ = 0x53;
    }
  }
  if (deflatedata._4_4_ == 0) {
    value = adler32((uchar *)insize_local,(uint)settings_local);
    *(undefined1 *)*outsize_local = 0x78;
    *(undefined1 *)(*outsize_local + 1) = 1;
    for (sStack_38 = 0; sStack_38 != _CMF; sStack_38 = sStack_38 + 1) {
      *(undefined1 *)(*outsize_local + 2 + sStack_38) = *(undefined1 *)(deflatesize + sStack_38);
    }
    lodepng_set32bitInt((uchar *)(*outsize_local + *(long *)in_local + -4),value);
  }
  lodepng_free((void *)deflatesize);
  return deflatedata._4_4_;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings) {
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  *out = NULL;
  *outsize = 0;
  if(!error) {
    *outsize = deflatesize + 6;
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!*out) error = 83; /*alloc fail*/
  }

  if(!error) {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
    unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
    unsigned FLEVEL = 0;
    unsigned FDICT = 0;
    unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
    unsigned FCHECK = 31 - CMFFLG % 31;
    CMFFLG += FCHECK;

    (*out)[0] = (unsigned char)(CMFFLG >> 8);
    (*out)[1] = (unsigned char)(CMFFLG & 255);
    for(i = 0; i != deflatesize; ++i) (*out)[i + 2] = deflatedata[i];
    lodepng_set32bitInt(&(*out)[*outsize - 4], ADLER32);
  }

  lodepng_free(deflatedata);
  return error;
}